

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall QL_Manager::ParseSelectAttrs(QL_Manager *this,int nSelAttrs,RelAttr *selAttrs)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  size_t __n;
  int local_2c;
  int i;
  RelAttr *selAttrs_local;
  int nSelAttrs_local;
  QL_Manager *this_local;
  
  if (nSelAttrs == 1) {
    __s1 = selAttrs->attrName;
    __n = strlen(selAttrs->attrName);
    iVar2 = strncmp(__s1,"*",__n);
    if (iVar2 == 0) {
      return 0;
    }
  }
  local_2c = 0;
  while( true ) {
    if (nSelAttrs <= local_2c) {
      return 0;
    }
    bVar1 = IsValidAttr(this,selAttrs[local_2c]);
    if (!bVar1) break;
    local_2c = local_2c + 1;
  }
  return 0x194;
}

Assistant:

RC QL_Manager::ParseSelectAttrs(int nSelAttrs, const RelAttr selAttrs[]){
  // If it's select *, then it's valid
  if((nSelAttrs == 1 && strncmp(selAttrs[0].attrName, "*", strlen(selAttrs[0].attrName)) == 0))
    return (0);

  for(int i=0; i < nSelAttrs; i++){
    // Check that attribute name is valid:
    if(!IsValidAttr(selAttrs[i]))
      return (QL_ATTRNOTFOUND);  

  }
  return (0);
}